

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

int prvTidytmbstrcmp(ctmbstr s1,ctmbstr s2)

{
  ctmbstr ptStack_20;
  int c;
  ctmbstr s2_local;
  ctmbstr s1_local;
  
  ptStack_20 = s2;
  s2_local = s1;
  while( true ) {
    if (*s2_local != *ptStack_20) {
      s1_local._4_4_ = -1;
      if (*ptStack_20 < *s2_local) {
        s1_local._4_4_ = 1;
      }
      return s1_local._4_4_;
    }
    if (*s2_local == '\0') break;
    s2_local = s2_local + 1;
    ptStack_20 = ptStack_20 + 1;
  }
  return 0;
}

Assistant:

int TY_(tmbstrcmp)( ctmbstr s1, ctmbstr s2 )
{
    int c;
    while ((c = *s1) == *s2)
    {
        if (c == '\0')
            return 0;

        ++s1;
        ++s2;
    }

    return (*s1 > *s2 ? 1 : -1);
}